

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_i32 gen_dest_gpr(DisasContext_conflict8 *dc,int reg)

{
  TCGContext_conflict8 *tcg_ctx;
  int reg_local;
  DisasContext_conflict8 *dc_local;
  
  if (reg < 1) {
    dc_local = (DisasContext_conflict8 *)get_temp_tl(dc);
  }
  else {
    if (0x1f < reg) {
      __assert_fail("reg < 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                    ,0x140,"TCGv_i64 gen_dest_gpr(DisasContext *, int)");
    }
    dc_local = (DisasContext_conflict8 *)dc->uc->tcg_ctx->cpu_regs[reg];
  }
  return (TCGv_i32)dc_local;
}

Assistant:

static inline TCGv gen_dest_gpr(DisasContext *dc, int reg)
{
    if (reg > 0) {
        TCGContext *tcg_ctx = dc->uc->tcg_ctx;
        assert(reg < 32);
        return tcg_ctx->cpu_regs[reg];
    } else {
        return get_temp_tl(dc);
    }
}